

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>::
int_writer<int,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_>::on_bin
          (int_writer<int,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_> *this)

{
  char cVar1;
  uint uVar2;
  basic_format_specs<fmt::v5::char8_t> *pbVar3;
  int num_digits;
  bin_writer<1> f;
  string_view prefix;
  
  pbVar3 = this->spec;
  if (((pbVar3->super_core_format_specs).flags & 8) != 0) {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = (pbVar3->super_core_format_specs).type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  num_digits = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
               ::int_writer<int,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::count_digits<1u>
                         (this);
  f.num_digits = num_digits;
  f.abs_value = this->abs_value;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::
  write_int<fmt::v5::basic_format_specs<fmt::v5::char8_t>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<int,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::bin_writer<1>>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
              *)this->writer,num_digits,prefix,this->spec,f);
  return;
}

Assistant:

void on_bin() {
      if (spec.has(HASH_FLAG)) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(spec.type);
      }
      int num_digits = count_digits<1>();
      writer.write_int(num_digits, get_prefix(), spec,
                       bin_writer<1>{abs_value, num_digits});
    }